

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall cimg_library::CImgDisplay::paint(CImgDisplay *this,bool wait_expose)

{
  Display *pDVar1;
  
  if ((this->_width != 0) && (this->_height != 0)) {
    if (cimg::X11_attr()::val == '\0') {
      paint();
    }
    pDVar1 = cimg::X11_attr::val.display;
    XLockDisplay(cimg::X11_attr::val.display);
    _paint(this,wait_expose);
    XUnlockDisplay(pDVar1);
  }
  return this;
}

Assistant:

CImgDisplay& paint(const bool wait_expose=true) {
      if (is_empty()) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      _paint(wait_expose);
      XUnlockDisplay(dpy);
      return *this;
    }